

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

RC __thiscall
QO_Manager::NormalizeStats
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,float frac,float numTuples,int attrIdx1,int attrIdx2)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  float fVar4;
  int attrIdx;
  _Rb_tree_color local_34;
  
  p_Var3 = (attr_stats->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(attr_stats->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      local_34 = p_Var3[1]._M_color;
      if (local_34 != attrIdx2 && local_34 != attrIdx1) {
        pmVar2 = std::
                 map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                 ::operator[](attr_stats,(key_type *)&local_34);
        fVar4 = pmVar2->numTuples;
        if (numTuples <= pmVar2->numTuples) {
          fVar4 = numTuples;
        }
        pmVar2 = std::
                 map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                 ::operator[](attr_stats,(key_type *)&local_34);
        pmVar2->numTuples = fVar4;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return 0;
}

Assistant:

RC QO_Manager::NormalizeStats(map<int, attrStat> &attr_stats, float frac, float numTuples, int attrIdx1, int attrIdx2){
  map<int, attrStat>::iterator it;
  for(it = attr_stats.begin(); it != attr_stats.end(); ++it){
    int attrIdx = it->first;
    if(attrIdx != attrIdx1 && attrIdx != attrIdx2){
      attr_stats[attrIdx].numTuples = min(numTuples, attr_stats[attrIdx].numTuples);
     // attr_stats[attrIdx].numTuples = attr_stats[attrIdx].numTuples*frac;
    }
  }
  return (0);
}